

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR CorUnix::CPalSynchronizationManager::SignalThreadCondition
                    (ThreadNativeWaitData *ptnwdNativeWaitData)

{
  int iVar1;
  int *piVar2;
  PAL_ERROR PVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)ptnwdNativeWaitData);
  if (iVar1 == 0) {
    ptnwdNativeWaitData->iPred = 1;
    iVar1 = pthread_cond_signal((pthread_cond_t *)&ptnwdNativeWaitData->cond);
    if (iVar1 == 0) {
      PVar3 = 0;
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00348ec6;
      piVar2 = __errno_location();
      strerror(*piVar2);
      PVar3 = 0x54f;
    }
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)ptnwdNativeWaitData);
    if (iVar1 == 0) {
      return PVar3;
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return 0x54f;
  }
LAB_00348ec6:
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::SignalThreadCondition(
        ThreadNativeWaitData * ptnwdNativeWaitData)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet;

        // Lock the mutex
        iRet = pthread_mutex_lock(&ptnwdNativeWaitData->mutex);
        if (0 != iRet)
        {
            ERROR("Cannot lock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            goto WUT_exit;
        }

        // Set the predicate
        ptnwdNativeWaitData->iPred = TRUE;

        // Signal the condition
        iRet = pthread_cond_signal(&ptnwdNativeWaitData->cond);
        if (0 != iRet)
        {
            ERROR("Failed to signal condition: pthread_cond_signal "
                  "returned %d [errno=%d (%s)]\n", iRet, errno,
                  strerror(errno));
            palErr = ERROR_INTERNAL_ERROR;
            // Continue in order to unlock the mutex anyway
        }

        // Unlock the mutex
        iRet = pthread_mutex_unlock(&ptnwdNativeWaitData->mutex);
        if (0 != iRet)
        {
            ERROR("Cannot unlock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            goto WUT_exit;
        }

    WUT_exit:
        return palErr;
    }